

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal_cost.c
# Opt level: O1

void BrotliEstimateBitCostsForLiterals(size_t pos,size_t len,size_t mask,uint8_t *data,float *cost)

{
  long *plVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  byte bVar12;
  ulong *puVar13;
  double dVar14;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined8 uVar20;
  size_t in_window_utf8 [3];
  size_t histogram [3] [256];
  ulong local_1878 [4];
  ulong local_1858;
  float *local_1850;
  double local_1848;
  undefined8 uStack_1840;
  ulong local_1838 [769];
  
  local_1850 = cost;
  iVar4 = BrotliIsMostlyUTF8(data,pos,mask,len,0.75);
  if (iVar4 == 0) {
    memset(local_1838,0,0x800);
    uVar5 = 2000;
    if (len < 2000) {
      uVar5 = len;
    }
    uVar6 = pos;
    uVar7 = uVar5;
    if (len != 0) {
      do {
        local_1838[data[uVar6 & mask]] = local_1838[data[uVar6 & mask]] + 1;
        uVar7 = uVar7 - 1;
        uVar6 = uVar6 + 1;
      } while (uVar7 != 0);
      uVar6 = 2000;
      do {
        if (1999 < uVar6 - 2000) {
          local_1838[data[pos - 2000 & mask]] = local_1838[data[pos - 2000 & mask]] - 1;
          uVar5 = uVar5 - 1;
        }
        if (uVar6 < len) {
          local_1838[data[pos + 2000 & mask]] = local_1838[data[pos + 2000 & mask]] + 1;
          uVar5 = uVar5 + 1;
        }
        uVar7 = local_1838[data[pos & mask]];
        lVar8 = uVar7 + (uVar7 == 0);
        if (uVar5 < 0x100) {
          dVar19 = kLog2Table[uVar5];
          uVar20 = 0;
        }
        else {
          auVar17._8_4_ = (int)(uVar5 >> 0x20);
          auVar17._0_8_ = uVar5;
          auVar17._12_4_ = 0x45300000;
          dVar19 = log2((auVar17._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0));
          uVar20 = extraout_XMM0_Qb_00;
        }
        if (uVar7 < 0x100) {
          dVar14 = kLog2Table[lVar8];
        }
        else {
          auVar18._8_4_ = (int)((ulong)lVar8 >> 0x20);
          auVar18._0_8_ = lVar8;
          auVar18._12_4_ = 0x45300000;
          local_1848 = dVar19;
          uStack_1840 = uVar20;
          dVar14 = log2((auVar18._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0));
          dVar19 = local_1848;
        }
        dVar19 = (dVar19 - dVar14) + 0.029;
        local_1850[uVar6 - 2000] =
             (float)(double)(-(ulong)(dVar19 < 1.0) & (ulong)(dVar19 * 0.5 + 0.5) |
                            ~-(ulong)(dVar19 < 1.0) & (ulong)dVar19);
        pos = pos + 1;
        sVar10 = uVar6 - 1999;
        uVar6 = uVar6 + 1;
      } while (sVar10 != len);
    }
  }
  else {
    local_1838[0] = 0;
    local_1878[0] = 0;
    local_1858 = 0;
    if (len != 0) {
      sVar10 = pos;
      sVar11 = len;
      bVar12 = 0;
      do {
        bVar2 = data[sVar10 & mask];
        puVar13 = local_1838;
        if ((((char)bVar2 < '\0') && (puVar13 = local_1878, bVar2 < 0xc0)) &&
           (puVar13 = local_1838, 0xdf < bVar12)) {
          puVar13 = &local_1858;
        }
        *puVar13 = *puVar13 + 1;
        sVar10 = sVar10 + 1;
        sVar11 = sVar11 - 1;
        bVar12 = bVar2;
      } while (sVar11 != 0);
    }
    uVar5 = local_1878[0] + local_1858;
    memset(local_1838,0,0x1800);
    sVar10 = 0x1ef;
    if (len < 0x1ef) {
      sVar10 = len;
    }
    local_1878[0] = 0;
    local_1878[1] = 0;
    local_1878[2] = 0;
    if (len != 0) {
      uVar7 = (ulong)(0x18 < uVar5);
      uVar6 = 0;
      sVar11 = pos;
      uVar5 = 0;
      do {
        bVar12 = data[sVar11 & mask];
        local_1838[uVar6 * 0x100 + (ulong)bVar12] = local_1838[uVar6 * 0x100 + (ulong)bVar12] + 1;
        local_1878[uVar6] = local_1878[uVar6] + 1;
        if ((char)bVar12 < '\0') {
          uVar6 = uVar7;
          if ((bVar12 < 0xc0) && (uVar5 < 0xe0)) {
            uVar6 = 0;
          }
        }
        else {
          uVar6 = 0;
        }
        sVar11 = sVar11 + 1;
        sVar10 = sVar10 - 1;
        uVar5 = (ulong)bVar12;
      } while (sVar10 != 0);
      lVar8 = 2000;
      uVar5 = 0;
      do {
        if (0x1ee < uVar5) {
          if (uVar5 == 0x1ef) {
            bVar12 = 0;
          }
          else {
            bVar12 = data[(uVar5 + pos) - 0x1f0 & mask];
          }
          if (uVar5 < 0x1f1) {
            uVar6 = 0;
          }
          else {
            uVar6 = uVar7;
            if (data[(uVar5 + pos) - 0x1f1 & mask] < 0xe0) {
              uVar6 = 0;
            }
          }
          if (0xbf < bVar12) {
            uVar6 = uVar7;
          }
          if (bVar12 < 0x80) {
            uVar6 = 0;
          }
          plVar1 = (long *)((long)local_1838 +
                           (ulong)data[(uVar5 + pos) - 0x1ef & mask] * 8 +
                           (ulong)(uint)((int)uVar6 << 0xb));
          *plVar1 = *plVar1 + -1;
          local_1878[uVar6] = local_1878[uVar6] - 1;
        }
        if (uVar5 + 0x1ef < len) {
          if ((char)data[uVar5 + pos + 0x1ee & mask] < '\0') {
            uVar6 = uVar7;
            if ((data[uVar5 + pos + 0x1ee & mask] < 0xc0) &&
               (data[uVar5 + pos + 0x1ed & mask] < 0xe0)) {
              uVar6 = 0;
            }
          }
          else {
            uVar6 = 0;
          }
          plVar1 = (long *)((long)local_1838 +
                           (ulong)data[uVar5 + pos + 0x1ef & mask] * 8 +
                           (ulong)(uint)((int)uVar6 << 0xb));
          *plVar1 = *plVar1 + 1;
          local_1878[uVar6] = local_1878[uVar6] + 1;
        }
        if (uVar5 == 0) {
          bVar12 = 0;
        }
        else {
          bVar12 = data[(uVar5 + pos) - 1 & mask];
        }
        if (uVar5 < 2) {
          uVar6 = 0;
        }
        else {
          uVar6 = uVar7;
          if (data[(uVar5 + pos) - 2 & mask] < 0xe0) {
            uVar6 = 0;
          }
        }
        if (0xbf < bVar12) {
          uVar6 = uVar7;
        }
        if (bVar12 < 0x80) {
          uVar6 = 0;
        }
        uVar3 = *(ulong *)((long)local_1838 +
                          (ulong)data[uVar5 + pos & mask] * 8 + (ulong)(uint)((int)uVar6 << 0xb));
        lVar9 = uVar3 + (uVar3 == 0);
        uVar6 = local_1878[uVar6];
        if (uVar6 < 0x100) {
          dVar19 = kLog2Table[uVar6];
          uVar20 = 0;
        }
        else {
          auVar15._8_4_ = (int)(uVar6 >> 0x20);
          auVar15._0_8_ = uVar6;
          auVar15._12_4_ = 0x45300000;
          dVar19 = log2((auVar15._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0));
          uVar20 = extraout_XMM0_Qb;
        }
        if (uVar3 < 0x100) {
          dVar14 = kLog2Table[lVar9];
        }
        else {
          auVar16._8_4_ = (int)((ulong)lVar9 >> 0x20);
          auVar16._0_8_ = lVar9;
          auVar16._12_4_ = 0x45300000;
          local_1848 = dVar19;
          uStack_1840 = uVar20;
          dVar14 = log2((auVar16._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
          dVar19 = local_1848;
        }
        dVar19 = (dVar19 - dVar14) + 0.02905;
        dVar19 = (double)(-(ulong)(dVar19 < 1.0) & (ulong)(dVar19 * 0.5 + 0.5) |
                         ~-(ulong)(dVar19 < 1.0) & (ulong)dVar19);
        if (uVar5 < 2000) {
          dVar19 = dVar19 + ((double)lVar8 / -2000.0) * 0.35 + 0.7;
        }
        local_1850[uVar5] = (float)dVar19;
        uVar5 = uVar5 + 1;
        lVar8 = lVar8 + -1;
      } while (len != uVar5);
    }
  }
  return;
}

Assistant:

void BrotliEstimateBitCostsForLiterals(size_t pos, size_t len, size_t mask,
                                       const uint8_t* data, float* cost) {
  if (BrotliIsMostlyUTF8(data, pos, mask, len, kMinUTF8Ratio)) {
    EstimateBitCostsForLiteralsUTF8(pos, len, mask, data, cost);
    return;
  } else {
    size_t histogram[256] = { 0 };
    size_t window_half = 2000;
    size_t in_window = BROTLI_MIN(size_t, window_half, len);

    /* Bootstrap histogram. */
    size_t i;
    for (i = 0; i < in_window; ++i) {
      ++histogram[data[(pos + i) & mask]];
    }

    /* Compute bit costs with sliding window. */
    for (i = 0; i < len; ++i) {
      size_t histo;
      if (i >= window_half) {
        /* Remove a byte in the past. */
        --histogram[data[(pos + i - window_half) & mask]];
        --in_window;
      }
      if (i + window_half < len) {
        /* Add a byte in the future. */
        ++histogram[data[(pos + i + window_half) & mask]];
        ++in_window;
      }
      histo = histogram[data[(pos + i) & mask]];
      if (histo == 0) {
        histo = 1;
      }
      {
        double lit_cost = FastLog2(in_window) - FastLog2(histo);
        lit_cost += 0.029;
        if (lit_cost < 1.0) {
          lit_cost *= 0.5;
          lit_cost += 0.5;
        }
        cost[i] = (float)lit_cost;
      }
    }
  }
}